

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianProbitRegressor.pb.cc
# Opt level: O2

size_t __thiscall
CoreML::Specification::BayesianProbitRegressor_FeatureValueWeight::ByteSizeLong
          (BayesianProbitRegressor_FeatureValueWeight *this)

{
  int iVar1;
  size_t sVar2;
  uint uVar3;
  
  if (this->featureweight_ == (BayesianProbitRegressor_Gaussian *)0x0 ||
      this == (BayesianProbitRegressor_FeatureValueWeight *)
              &_BayesianProbitRegressor_FeatureValueWeight_default_instance_) {
    sVar2 = 0;
  }
  else {
    sVar2 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::BayesianProbitRegressor_Gaussian>
                      (this->featureweight_);
    sVar2 = sVar2 + 1;
  }
  if (this->featurevalue_ != 0) {
    uVar3 = this->featurevalue_ | 1;
    iVar1 = 0x1f;
    if (uVar3 != 0) {
      for (; uVar3 >> iVar1 == 0; iVar1 = iVar1 + -1) {
      }
    }
    sVar2 = sVar2 + (iVar1 * 9 + 0x49U >> 6) + 1;
  }
  this->_cached_size_ = (int)sVar2;
  return sVar2;
}

Assistant:

size_t BayesianProbitRegressor_FeatureValueWeight::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.BayesianProbitRegressor.FeatureValueWeight)
  size_t total_size = 0;

  // .CoreML.Specification.BayesianProbitRegressor.Gaussian featureWeight = 2;
  if (this->has_featureweight()) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->featureweight_);
  }

  // uint32 featureValue = 1;
  if (this->featurevalue() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::UInt32Size(
        this->featurevalue());
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}